

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

bool __thiscall front::syntax::SyntaxAnalyze::find_word(SyntaxAnalyze *this,Token tk,Token end)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Token in_EDX;
  Token in_ESI;
  long in_RDI;
  size_t i;
  bool r;
  size_t size;
  size_type local_28;
  
  sVar2 = std::vector<front::word::Word,_std::allocator<front::word::Word>_>::size
                    (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                      (in_RDI + 0x18));
  local_28 = *(size_type *)(in_RDI + 8);
  while( true ) {
    local_28 = local_28 + 1;
    if (sVar2 <= local_28) {
      return false;
    }
    pvVar3 = std::vector<front::word::Word,_std::allocator<front::word::Word>_>::operator[]
                       (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                         (in_RDI + 0x18),local_28);
    bVar1 = word::Word::match_token(pvVar3,in_ESI);
    if (bVar1) break;
    pvVar3 = std::vector<front::word::Word,_std::allocator<front::word::Word>_>::operator[]
                       (*(vector<front::word::Word,_std::allocator<front::word::Word>_> **)
                         (in_RDI + 0x18),local_28);
    bVar1 = word::Word::match_token(pvVar3,in_EDX);
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SyntaxAnalyze::find_word(Token tk, Token end) {
  size_t size = word_list.size();
  bool r = false;
  for (size_t i = matched_index + 1; i < size; i++) {
    if (word_list[i].match_token(tk)) {
      r = true;
      break;
    } else if (word_list[i].match_token(end)) {
      break;
    }
  }
  return r;
}